

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

prf_node_t * prf_state_get_instance(prf_state_t *state,int16_t number)

{
  int iVar1;
  short in_SI;
  long in_RDI;
  prf_instance_definition_data *data;
  int n;
  int i;
  int local_18;
  
  iVar1 = prf_array_count((void *)0x10751f);
  local_18 = 0;
  while( true ) {
    if (iVar1 <= local_18) {
      return (prf_node_t *)0x0;
    }
    if (*(short *)(*(long *)(*(long *)(*(long *)(in_RDI + 0x40) + (long)local_18 * 8) + 8) + 2) ==
        in_SI) break;
    local_18 = local_18 + 1;
  }
  return *(prf_node_t **)(*(long *)(in_RDI + 0x40) + (long)local_18 * 8);
}

Assistant:

prf_node_t *
prf_state_get_instance(
    prf_state_t * state, 
    int16_t number )
{
    int i, n;

    n = prf_array_count(state->instances);
    for (i = 0; i < n; i++) {
        struct prf_instance_definition_data * data = 
            (struct prf_instance_definition_data *) state->instances[i]->data;
        if ( data->instance_definition_number == number )
            return state->instances[i];
    }
    return NULL;
}